

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

void asl::printf_(char *fmt,...)

{
  char in_AL;
  int iVar1;
  char *__s;
  undefined8 in_RCX;
  undefined8 in_RDX;
  uint uVar2;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  int iVar3;
  bool bVar4;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arg;
  undefined1 local_4c8 [8];
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  undefined8 local_428;
  char buffer [1000];
  
  arg[0].reg_save_area = local_4c8;
  if (in_AL != '\0') {
    local_498 = in_XMM0_Qa;
    local_488 = in_XMM1_Qa;
    local_478 = in_XMM2_Qa;
    local_468 = in_XMM3_Qa;
    local_458 = in_XMM4_Qa;
    local_448 = in_XMM5_Qa;
    local_438 = in_XMM6_Qa;
    local_428 = in_XMM7_Qa;
  }
  arg[0].overflow_arg_area = &stack0x00000008;
  arg[0].gp_offset = 8;
  arg[0].fp_offset = 0x30;
  uVar2 = 1000;
  __s = buffer;
  iVar3 = 9;
  local_4c0 = in_RSI;
  local_4b8 = in_RDX;
  local_4b0 = in_RCX;
  local_4a8 = in_R8;
  local_4a0 = in_R9;
  while( true ) {
    iVar1 = vsnprintf(__s,(ulong)uVar2,fmt,arg);
    if ((iVar1 != -1 && iVar1 <= (int)uVar2) || (bVar4 = iVar3 == 0, iVar3 = iVar3 + -1, bVar4))
    break;
    if (1000 < uVar2) {
      operator_delete__(__s);
    }
    uVar2 = uVar2 * 2;
    __s = (char *)operator_new__((long)(int)uVar2);
  }
  fwrite(__s,(long)iVar1,1,_stdout);
  if (1000 < uVar2) {
    operator_delete__(__s);
  }
  return;
}

Assistant:

void printf_(const char* fmt, ...)
{
	const int N = 1000;
	char    buffer[N];
	char* str = buffer;
	va_list arg;
	va_start(arg, fmt);
	int i=0, n=0;
	int space = N;
	while(((n=vsnprintf(str, space, fmt, arg)) == -1 || n > space) && ++i < 10)
	{
		if (space > N)
			delete [] str;
		space *= 2;
		str = new char[space];
	}
	va_end(arg);
	fwrite(str, n, 1, stdout);
	if (space > N)
		delete [] str;
}